

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMem.c
# Opt level: O1

char * Gia_MmFixedEntryFetch(Gia_MmFixed_t *p)

{
  int iVar1;
  int iVar2;
  char **ppcVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  size_t __size;
  
  if (p->nEntriesUsed == p->nEntriesAlloc) {
    if (p->pEntriesFree != (char *)0x0) {
      __assert_fail("p->pEntriesFree == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMem.c"
                    ,0xa9,"char *Gia_MmFixedEntryFetch(Gia_MmFixed_t *)");
    }
    iVar1 = p->nChunksAlloc;
    if (p->nChunks == iVar1) {
      p->nChunksAlloc = iVar1 * 2;
      if (p->pChunks == (char **)0x0) {
        ppcVar3 = (char **)malloc((long)iVar1 << 4);
      }
      else {
        ppcVar3 = (char **)realloc(p->pChunks,(long)iVar1 << 4);
      }
      p->pChunks = ppcVar3;
    }
    iVar1 = p->nEntrySize;
    iVar2 = p->nChunkSize;
    __size = (long)iVar2 * (long)iVar1;
    pcVar4 = (char *)malloc(__size);
    p->nMemoryAlloc = p->nMemoryAlloc + (int)__size;
    p->pEntriesFree = pcVar4;
    pcVar6 = pcVar4;
    if (1 < (long)iVar2) {
      iVar5 = iVar2 + -1;
      pcVar7 = pcVar4;
      do {
        pcVar6 = pcVar7 + iVar1;
        *(char **)pcVar7 = pcVar6;
        iVar5 = iVar5 + -1;
        pcVar7 = pcVar6;
      } while (iVar5 != 0);
    }
    pcVar6[0] = '\0';
    pcVar6[1] = '\0';
    pcVar6[2] = '\0';
    pcVar6[3] = '\0';
    pcVar6[4] = '\0';
    pcVar6[5] = '\0';
    pcVar6[6] = '\0';
    pcVar6[7] = '\0';
    iVar1 = p->nChunks;
    p->nChunks = iVar1 + 1;
    p->pChunks[iVar1] = pcVar4;
    p->nEntriesAlloc = p->nEntriesAlloc + iVar2;
  }
  iVar2 = p->nEntriesUsed;
  iVar1 = iVar2 + 1;
  p->nEntriesUsed = iVar1;
  if (p->nEntriesMax <= iVar2) {
    p->nEntriesMax = iVar1;
  }
  pcVar6 = p->pEntriesFree;
  p->pEntriesFree = *(char **)pcVar6;
  return pcVar6;
}

Assistant:

char * Gia_MmFixedEntryFetch( Gia_MmFixed_t * p )
{
    char * pTemp;
    int i;

    // check if there are still free entries
    if ( p->nEntriesUsed == p->nEntriesAlloc )
    { // need to allocate more entries
        assert( p->pEntriesFree == NULL );
        if ( p->nChunks == p->nChunksAlloc )
        {
            p->nChunksAlloc *= 2;
            p->pChunks = ABC_REALLOC( char *, p->pChunks, p->nChunksAlloc ); 
        }
        p->pEntriesFree = ABC_ALLOC( char, p->nEntrySize * p->nChunkSize );
        p->nMemoryAlloc += p->nEntrySize * p->nChunkSize;
        // transform these entries into a linked list
        pTemp = p->pEntriesFree;
        for ( i = 1; i < p->nChunkSize; i++ )
        {
            *((char **)pTemp) = pTemp + p->nEntrySize;
            pTemp += p->nEntrySize;
        }
        // set the last link
        *((char **)pTemp) = NULL;
        // add the chunk to the chunk storage
        p->pChunks[ p->nChunks++ ] = p->pEntriesFree;
        // add to the number of entries allocated
        p->nEntriesAlloc += p->nChunkSize;
    }
    // incrememt the counter of used entries
    p->nEntriesUsed++;
    if ( p->nEntriesMax < p->nEntriesUsed )
        p->nEntriesMax = p->nEntriesUsed;
    // return the first entry in the free entry list
    pTemp = p->pEntriesFree;
    p->pEntriesFree = *((char **)pTemp);
    return pTemp;
}